

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.cpp
# Opt level: O3

void stbi__start_file(stbi__context *s,FILE *f)

{
  stbi_uc *psVar1;
  int iVar2;
  stbi_uc *psVar3;
  
  (s->io).eof = stbi__stdio_eof;
  *(undefined4 *)&(s->io).read = 0x1429f1;
  *(undefined4 *)((long)&(s->io).read + 4) = 0;
  *(undefined4 *)&(s->io).skip = 0x142a07;
  *(undefined4 *)((long)&(s->io).skip + 4) = 0;
  s->io_user_data = f;
  s->read_from_callbacks = 1;
  s->buflen = 0x80;
  psVar1 = s->buffer_start;
  s->img_buffer_original = psVar1;
  iVar2 = (*(s->io).read)(f,(char *)psVar1,0x80);
  if (iVar2 == 0) {
    s->read_from_callbacks = 0;
    psVar3 = s->buffer_start + 1;
    s->buffer_start[0] = '\0';
  }
  else {
    psVar3 = psVar1 + iVar2;
  }
  s->img_buffer = psVar1;
  s->img_buffer_end = psVar3;
  s->img_buffer_original_end = psVar3;
  return;
}

Assistant:

static void stbi__start_file(stbi__context *s, FILE *f)
{
   stbi__start_callbacks(s, &stbi__stdio_callbacks, (void *) f);
}